

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void diy::Serialization<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::save
               (BinaryBuffer *bb,Vector *v)

{
  pointer puVar1;
  size_t s;
  long local_20;
  
  local_20 = (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_20,8);
  if (local_20 != 0) {
    puVar1 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*bb->_vptr_BinaryBuffer[2])
              (bb,puVar1,
               (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }